

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O0

int __thiscall deqp::gles31::Functional::DrawTests::init(DrawTests *this,EVP_PKEY_CTX *ctx)

{
  Context *context;
  int extraout_EAX;
  MethodGroup *this_00;
  char *name_00;
  char *descr;
  TestNode *pTVar1;
  DrawMethod method;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined1 local_60 [8];
  string desc;
  string name;
  DrawMethod DStack_18;
  int ndx;
  DrawMethod basicMethods [2];
  DrawTests *this_local;
  
  basicMethods = (DrawMethod  [2])this;
  _DStack_18 = 0x600000002;
  for (name.field_2._12_4_ = 0; (int)name.field_2._12_4_ < 2;
      name.field_2._12_4_ = name.field_2._12_4_ + 1) {
    deqp::gls::DrawTestSpec::drawMethodToString_abi_cxx11_
              ((string *)((long)&desc.field_2 + 8),
               (DrawTestSpec *)(ulong)(&DStack_18)[(int)name.field_2._12_4_],(DrawMethod)in_RDX);
    deqp::gls::DrawTestSpec::drawMethodToString_abi_cxx11_
              ((string *)local_60,(DrawTestSpec *)(ulong)(&DStack_18)[(int)name.field_2._12_4_],
               method);
    this_00 = (MethodGroup *)operator_new(0x80);
    context = (this->super_TestCaseGroup).m_context;
    name_00 = (char *)std::__cxx11::string::c_str();
    descr = (char *)std::__cxx11::string::c_str();
    Functional::anon_unknown_0::MethodGroup::MethodGroup
              (this_00,context,name_00,descr,(&DStack_18)[(int)name.field_2._12_4_]);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    std::__cxx11::string::~string((string *)local_60);
    std::__cxx11::string::~string((string *)(desc.field_2._M_local_buf + 8));
    in_RDX = extraout_RDX;
  }
  pTVar1 = (TestNode *)operator_new(0x78);
  Functional::anon_unknown_0::InstancingGroup::InstancingGroup
            ((InstancingGroup *)pTVar1,(this->super_TestCaseGroup).m_context,"instancing",
             "draw tests with a large instance count.");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  Functional::anon_unknown_0::ComputeShaderGeneratedGroup::ComputeShaderGeneratedGroup
            ((ComputeShaderGeneratedGroup *)pTVar1,(this->super_TestCaseGroup).m_context,
             "compute_interop","draw tests with a draw command generated in compute shader.");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  Functional::anon_unknown_0::RandomGroup::RandomGroup
            ((RandomGroup *)pTVar1,(this->super_TestCaseGroup).m_context,"random",
             "random draw commands.");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  Functional::anon_unknown_0::NegativeGroup::NegativeGroup
            ((NegativeGroup *)pTVar1,(this->super_TestCaseGroup).m_context,"negative",
             "invalid draw commands with defined error codes.");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void DrawTests::init (void)
{
	// Basic
	{
		const gls::DrawTestSpec::DrawMethod basicMethods[] =
		{
			gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS_INDIRECT,
			gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_INDIRECT,
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(basicMethods); ++ndx)
		{
			const std::string name = gls::DrawTestSpec::drawMethodToString(basicMethods[ndx]);
			const std::string desc = gls::DrawTestSpec::drawMethodToString(basicMethods[ndx]);

			this->addChild(new MethodGroup(m_context, name.c_str(), desc.c_str(), basicMethods[ndx]));
		}
	}

	// extreme instancing

	this->addChild(new InstancingGroup(m_context, "instancing", "draw tests with a large instance count."));

	// compute shader generated commands

	this->addChild(new ComputeShaderGeneratedGroup(m_context, "compute_interop", "draw tests with a draw command generated in compute shader."));

	// Random

	this->addChild(new RandomGroup(m_context, "random", "random draw commands."));

	// negative

	this->addChild(new NegativeGroup(m_context, "negative", "invalid draw commands with defined error codes."));
}